

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O2

void aom_minmax_8x8_sse2(uint8_t *s,int p,uint8_t *d,int dp,int *min,int *max)

{
  ulong uVar1;
  ulong uVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [15];
  undefined1 auVar116 [15];
  undefined1 auVar117 [15];
  undefined1 auVar118 [15];
  undefined1 auVar119 [15];
  undefined1 auVar120 [15];
  undefined1 auVar121 [15];
  undefined1 auVar122 [15];
  undefined1 auVar123 [15];
  unkuint9 Var124;
  undefined1 auVar125 [11];
  undefined1 auVar126 [15];
  unkuint9 Var127;
  undefined1 auVar128 [11];
  undefined1 auVar129 [15];
  undefined1 auVar130 [11];
  undefined1 auVar131 [15];
  undefined1 auVar132 [11];
  undefined1 auVar133 [15];
  undefined1 auVar134 [11];
  undefined1 auVar135 [15];
  undefined1 auVar136 [11];
  undefined1 auVar137 [15];
  undefined1 auVar138 [11];
  undefined1 auVar139 [15];
  undefined1 auVar140 [11];
  undefined1 auVar141 [15];
  undefined1 auVar142 [11];
  undefined1 auVar143 [15];
  undefined1 auVar144 [11];
  undefined1 auVar145 [15];
  undefined1 auVar146 [11];
  undefined1 auVar147 [15];
  undefined1 auVar148 [11];
  undefined1 auVar149 [15];
  undefined1 auVar150 [11];
  undefined1 auVar151 [15];
  undefined1 auVar152 [11];
  undefined1 auVar153 [15];
  undefined1 auVar154 [11];
  undefined1 auVar155 [15];
  undefined1 auVar156 [11];
  undefined1 auVar157 [15];
  undefined1 auVar158 [15];
  undefined1 auVar159 [15];
  undefined1 auVar160 [15];
  undefined1 auVar161 [15];
  undefined1 auVar162 [15];
  undefined1 auVar163 [15];
  undefined1 auVar164 [15];
  undefined1 auVar165 [15];
  undefined1 auVar166 [15];
  undefined1 auVar167 [15];
  undefined1 auVar168 [15];
  undefined1 auVar169 [15];
  undefined1 auVar170 [15];
  undefined1 auVar171 [15];
  undefined1 auVar172 [15];
  undefined1 auVar173 [15];
  undefined1 auVar174 [15];
  undefined1 auVar175 [15];
  undefined1 auVar176 [15];
  undefined1 auVar177 [15];
  undefined1 auVar178 [15];
  undefined1 auVar179 [15];
  undefined1 auVar180 [15];
  undefined1 auVar181 [15];
  undefined1 auVar182 [15];
  undefined1 auVar183 [15];
  undefined1 auVar184 [15];
  undefined1 auVar185 [15];
  undefined1 auVar186 [15];
  undefined1 auVar187 [15];
  undefined1 auVar188 [15];
  long lVar189;
  long lVar190;
  short sVar191;
  short sVar192;
  short sVar193;
  short sVar194;
  short sVar195;
  short sVar196;
  short sVar197;
  short sVar198;
  ushort uVar199;
  ushort uVar200;
  ushort uVar201;
  ushort uVar202;
  ushort uVar203;
  ushort uVar204;
  ushort uVar205;
  ushort uVar206;
  ushort uVar207;
  ushort uVar208;
  ushort uVar209;
  ushort uVar210;
  ushort uVar211;
  ushort uVar212;
  ushort uVar213;
  ushort uVar214;
  ushort uVar215;
  ushort uVar216;
  ushort uVar217;
  ushort uVar218;
  ushort uVar219;
  ushort uVar220;
  ushort uVar221;
  ushort uVar222;
  ushort uVar223;
  ushort uVar224;
  ushort uVar225;
  ushort uVar226;
  ushort uVar227;
  ushort uVar228;
  ushort uVar229;
  ushort uVar230;
  ushort uVar231;
  ushort uVar232;
  ushort uVar233;
  ushort uVar234;
  ushort uVar235;
  ushort uVar236;
  ushort uVar237;
  ushort uVar238;
  
  uVar1 = *(ulong *)s;
  auVar11._8_6_ = 0;
  auVar11._0_8_ = uVar1;
  auVar11[0xe] = (char)(uVar1 >> 0x38);
  auVar27._8_4_ = 0;
  auVar27._0_8_ = uVar1;
  auVar27[0xc] = (char)(uVar1 >> 0x30);
  auVar27._13_2_ = auVar11._13_2_;
  auVar43._8_4_ = 0;
  auVar43._0_8_ = uVar1;
  auVar43._12_3_ = auVar27._12_3_;
  auVar59._8_2_ = 0;
  auVar59._0_8_ = uVar1;
  auVar59[10] = (char)(uVar1 >> 0x28);
  auVar59._11_4_ = auVar43._11_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar1;
  auVar75._10_5_ = auVar59._10_5_;
  auVar91[8] = (char)(uVar1 >> 0x20);
  auVar91._0_8_ = uVar1;
  auVar91._9_6_ = auVar75._9_6_;
  auVar123._7_8_ = 0;
  auVar123._0_7_ = auVar91._8_7_;
  Var124 = CONCAT81(SUB158(auVar123 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar157._9_6_ = 0;
  auVar157._0_9_ = Var124;
  auVar125._1_10_ = SUB1510(auVar157 << 0x30,5);
  auVar125[0] = (char)(uVar1 >> 0x10);
  auVar158._11_4_ = 0;
  auVar158._0_11_ = auVar125;
  auVar107[2] = (char)(uVar1 >> 8);
  auVar107._0_2_ = (ushort)uVar1;
  auVar107._3_12_ = SUB1512(auVar158 << 0x20,3);
  uVar2 = *(ulong *)d;
  auVar12._8_6_ = 0;
  auVar12._0_8_ = uVar2;
  auVar12[0xe] = (char)(uVar2 >> 0x38);
  auVar28._8_4_ = 0;
  auVar28._0_8_ = uVar2;
  auVar28[0xc] = (char)(uVar2 >> 0x30);
  auVar28._13_2_ = auVar12._13_2_;
  auVar44._8_4_ = 0;
  auVar44._0_8_ = uVar2;
  auVar44._12_3_ = auVar28._12_3_;
  auVar60._8_2_ = 0;
  auVar60._0_8_ = uVar2;
  auVar60[10] = (char)(uVar2 >> 0x28);
  auVar60._11_4_ = auVar44._11_4_;
  auVar76._8_2_ = 0;
  auVar76._0_8_ = uVar2;
  auVar76._10_5_ = auVar60._10_5_;
  auVar92[8] = (char)(uVar2 >> 0x20);
  auVar92._0_8_ = uVar2;
  auVar92._9_6_ = auVar76._9_6_;
  auVar126._7_8_ = 0;
  auVar126._0_7_ = auVar92._8_7_;
  Var127 = CONCAT81(SUB158(auVar126 << 0x40,7),(char)(uVar2 >> 0x18));
  auVar159._9_6_ = 0;
  auVar159._0_9_ = Var127;
  auVar128._1_10_ = SUB1510(auVar159 << 0x30,5);
  auVar128[0] = (char)(uVar2 >> 0x10);
  auVar160._11_4_ = 0;
  auVar160._0_11_ = auVar128;
  auVar108[2] = (char)(uVar2 >> 8);
  auVar108._0_2_ = (ushort)uVar2;
  auVar108._3_12_ = SUB1512(auVar160 << 0x20,3);
  sVar191 = ((ushort)uVar1 & 0xff) - ((ushort)uVar2 & 0xff);
  sVar192 = auVar107._2_2_ - auVar108._2_2_;
  sVar193 = auVar125._0_2_ - auVar128._0_2_;
  sVar194 = (short)Var124 - (short)Var127;
  sVar195 = auVar91._8_2_ - auVar92._8_2_;
  sVar196 = auVar59._10_2_ - auVar60._10_2_;
  sVar197 = auVar27._12_2_ - auVar28._12_2_;
  sVar198 = (auVar11._13_2_ >> 8) - (auVar12._13_2_ >> 8);
  sVar3 = -sVar191;
  sVar4 = -sVar192;
  sVar5 = -sVar193;
  sVar6 = -sVar194;
  sVar7 = -sVar195;
  sVar8 = -sVar196;
  sVar9 = -sVar197;
  sVar10 = -sVar198;
  uVar207 = (ushort)(sVar3 < sVar191) * sVar191 | (ushort)(sVar3 >= sVar191) * sVar3;
  uVar208 = (ushort)(sVar4 < sVar192) * sVar192 | (ushort)(sVar4 >= sVar192) * sVar4;
  uVar209 = (ushort)(sVar5 < sVar193) * sVar193 | (ushort)(sVar5 >= sVar193) * sVar5;
  uVar210 = (ushort)(sVar6 < sVar194) * sVar194 | (ushort)(sVar6 >= sVar194) * sVar6;
  uVar211 = (ushort)(sVar7 < sVar195) * sVar195 | (ushort)(sVar7 >= sVar195) * sVar7;
  uVar212 = (ushort)(sVar8 < sVar196) * sVar196 | (ushort)(sVar8 >= sVar196) * sVar8;
  uVar213 = (ushort)(sVar9 < sVar197) * sVar197 | (ushort)(sVar9 >= sVar197) * sVar9;
  uVar214 = (ushort)(sVar10 < sVar198) * sVar198 | (ushort)(sVar10 >= sVar198) * sVar10;
  lVar189 = (long)p;
  uVar1 = *(ulong *)(s + lVar189);
  auVar13._8_6_ = 0;
  auVar13._0_8_ = uVar1;
  auVar13[0xe] = (char)(uVar1 >> 0x38);
  auVar29._8_4_ = 0;
  auVar29._0_8_ = uVar1;
  auVar29[0xc] = (char)(uVar1 >> 0x30);
  auVar29._13_2_ = auVar13._13_2_;
  auVar45._8_4_ = 0;
  auVar45._0_8_ = uVar1;
  auVar45._12_3_ = auVar29._12_3_;
  auVar61._8_2_ = 0;
  auVar61._0_8_ = uVar1;
  auVar61[10] = (char)(uVar1 >> 0x28);
  auVar61._11_4_ = auVar45._11_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar1;
  auVar77._10_5_ = auVar61._10_5_;
  auVar93[8] = (char)(uVar1 >> 0x20);
  auVar93._0_8_ = uVar1;
  auVar93._9_6_ = auVar77._9_6_;
  auVar129._7_8_ = 0;
  auVar129._0_7_ = auVar93._8_7_;
  Var124 = CONCAT81(SUB158(auVar129 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar161._9_6_ = 0;
  auVar161._0_9_ = Var124;
  auVar130._1_10_ = SUB1510(auVar161 << 0x30,5);
  auVar130[0] = (char)(uVar1 >> 0x10);
  auVar162._11_4_ = 0;
  auVar162._0_11_ = auVar130;
  auVar109[2] = (char)(uVar1 >> 8);
  auVar109._0_2_ = (ushort)uVar1;
  auVar109._3_12_ = SUB1512(auVar162 << 0x20,3);
  lVar190 = (long)dp;
  uVar2 = *(ulong *)(d + lVar190);
  auVar14._8_6_ = 0;
  auVar14._0_8_ = uVar2;
  auVar14[0xe] = (char)(uVar2 >> 0x38);
  auVar30._8_4_ = 0;
  auVar30._0_8_ = uVar2;
  auVar30[0xc] = (char)(uVar2 >> 0x30);
  auVar30._13_2_ = auVar14._13_2_;
  auVar46._8_4_ = 0;
  auVar46._0_8_ = uVar2;
  auVar46._12_3_ = auVar30._12_3_;
  auVar62._8_2_ = 0;
  auVar62._0_8_ = uVar2;
  auVar62[10] = (char)(uVar2 >> 0x28);
  auVar62._11_4_ = auVar46._11_4_;
  auVar78._8_2_ = 0;
  auVar78._0_8_ = uVar2;
  auVar78._10_5_ = auVar62._10_5_;
  auVar94[8] = (char)(uVar2 >> 0x20);
  auVar94._0_8_ = uVar2;
  auVar94._9_6_ = auVar78._9_6_;
  auVar131._7_8_ = 0;
  auVar131._0_7_ = auVar94._8_7_;
  Var127 = CONCAT81(SUB158(auVar131 << 0x40,7),(char)(uVar2 >> 0x18));
  auVar163._9_6_ = 0;
  auVar163._0_9_ = Var127;
  auVar132._1_10_ = SUB1510(auVar163 << 0x30,5);
  auVar132[0] = (char)(uVar2 >> 0x10);
  auVar164._11_4_ = 0;
  auVar164._0_11_ = auVar132;
  auVar110[2] = (char)(uVar2 >> 8);
  auVar110._0_2_ = (ushort)uVar2;
  auVar110._3_12_ = SUB1512(auVar164 << 0x20,3);
  sVar191 = ((ushort)uVar1 & 0xff) - ((ushort)uVar2 & 0xff);
  sVar192 = auVar109._2_2_ - auVar110._2_2_;
  sVar193 = auVar130._0_2_ - auVar132._0_2_;
  sVar194 = (short)Var124 - (short)Var127;
  sVar195 = auVar93._8_2_ - auVar94._8_2_;
  sVar196 = auVar61._10_2_ - auVar62._10_2_;
  sVar197 = auVar29._12_2_ - auVar30._12_2_;
  sVar198 = (auVar13._13_2_ >> 8) - (auVar14._13_2_ >> 8);
  sVar3 = -sVar191;
  sVar4 = -sVar192;
  sVar5 = -sVar193;
  sVar6 = -sVar194;
  sVar7 = -sVar195;
  sVar8 = -sVar196;
  sVar9 = -sVar197;
  sVar10 = -sVar198;
  uVar215 = (ushort)(sVar3 < sVar191) * sVar191 | (ushort)(sVar3 >= sVar191) * sVar3;
  uVar217 = (ushort)(sVar4 < sVar192) * sVar192 | (ushort)(sVar4 >= sVar192) * sVar4;
  uVar219 = (ushort)(sVar5 < sVar193) * sVar193 | (ushort)(sVar5 >= sVar193) * sVar5;
  uVar221 = (ushort)(sVar6 < sVar194) * sVar194 | (ushort)(sVar6 >= sVar194) * sVar6;
  uVar223 = (ushort)(sVar7 < sVar195) * sVar195 | (ushort)(sVar7 >= sVar195) * sVar7;
  uVar225 = (ushort)(sVar8 < sVar196) * sVar196 | (ushort)(sVar8 >= sVar196) * sVar8;
  uVar227 = (ushort)(sVar9 < sVar197) * sVar197 | (ushort)(sVar9 >= sVar197) * sVar9;
  uVar229 = (ushort)(sVar10 < sVar198) * sVar198 | (ushort)(sVar10 >= sVar198) * sVar10;
  uVar199 = ((short)uVar207 < (short)uVar215) * uVar215 |
            ((short)uVar207 >= (short)uVar215) * uVar207;
  uVar200 = ((short)uVar208 < (short)uVar217) * uVar217 |
            ((short)uVar208 >= (short)uVar217) * uVar208;
  uVar201 = ((short)uVar209 < (short)uVar219) * uVar219 |
            ((short)uVar209 >= (short)uVar219) * uVar209;
  uVar202 = ((short)uVar210 < (short)uVar221) * uVar221 |
            ((short)uVar210 >= (short)uVar221) * uVar210;
  uVar203 = ((short)uVar211 < (short)uVar223) * uVar223 |
            ((short)uVar211 >= (short)uVar223) * uVar211;
  uVar204 = ((short)uVar212 < (short)uVar225) * uVar225 |
            ((short)uVar212 >= (short)uVar225) * uVar212;
  uVar205 = ((short)uVar213 < (short)uVar227) * uVar227 |
            ((short)uVar213 >= (short)uVar227) * uVar213;
  uVar206 = ((short)uVar214 < (short)uVar229) * uVar229 |
            ((short)uVar214 >= (short)uVar229) * uVar214;
  uVar216 = ((short)uVar207 < (short)uVar215) * uVar207 |
            ((short)uVar207 >= (short)uVar215) * uVar215;
  uVar218 = ((short)uVar208 < (short)uVar217) * uVar208 |
            ((short)uVar208 >= (short)uVar217) * uVar217;
  uVar220 = ((short)uVar209 < (short)uVar219) * uVar209 |
            ((short)uVar209 >= (short)uVar219) * uVar219;
  uVar222 = ((short)uVar210 < (short)uVar221) * uVar210 |
            ((short)uVar210 >= (short)uVar221) * uVar221;
  uVar224 = ((short)uVar211 < (short)uVar223) * uVar211 |
            ((short)uVar211 >= (short)uVar223) * uVar223;
  uVar226 = ((short)uVar212 < (short)uVar225) * uVar212 |
            ((short)uVar212 >= (short)uVar225) * uVar225;
  uVar228 = ((short)uVar213 < (short)uVar227) * uVar213 |
            ((short)uVar213 >= (short)uVar227) * uVar227;
  uVar230 = ((short)uVar214 < (short)uVar229) * uVar214 |
            ((short)uVar214 >= (short)uVar229) * uVar229;
  uVar1 = *(ulong *)(s + lVar189 * 2);
  auVar15._8_6_ = 0;
  auVar15._0_8_ = uVar1;
  auVar15[0xe] = (char)(uVar1 >> 0x38);
  auVar31._8_4_ = 0;
  auVar31._0_8_ = uVar1;
  auVar31[0xc] = (char)(uVar1 >> 0x30);
  auVar31._13_2_ = auVar15._13_2_;
  auVar47._8_4_ = 0;
  auVar47._0_8_ = uVar1;
  auVar47._12_3_ = auVar31._12_3_;
  auVar63._8_2_ = 0;
  auVar63._0_8_ = uVar1;
  auVar63[10] = (char)(uVar1 >> 0x28);
  auVar63._11_4_ = auVar47._11_4_;
  auVar79._8_2_ = 0;
  auVar79._0_8_ = uVar1;
  auVar79._10_5_ = auVar63._10_5_;
  auVar95[8] = (char)(uVar1 >> 0x20);
  auVar95._0_8_ = uVar1;
  auVar95._9_6_ = auVar79._9_6_;
  auVar133._7_8_ = 0;
  auVar133._0_7_ = auVar95._8_7_;
  Var124 = CONCAT81(SUB158(auVar133 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar165._9_6_ = 0;
  auVar165._0_9_ = Var124;
  auVar134._1_10_ = SUB1510(auVar165 << 0x30,5);
  auVar134[0] = (char)(uVar1 >> 0x10);
  auVar166._11_4_ = 0;
  auVar166._0_11_ = auVar134;
  auVar111[2] = (char)(uVar1 >> 8);
  auVar111._0_2_ = (ushort)uVar1;
  auVar111._3_12_ = SUB1512(auVar166 << 0x20,3);
  uVar2 = *(ulong *)(d + lVar190 * 2);
  auVar16._8_6_ = 0;
  auVar16._0_8_ = uVar2;
  auVar16[0xe] = (char)(uVar2 >> 0x38);
  auVar32._8_4_ = 0;
  auVar32._0_8_ = uVar2;
  auVar32[0xc] = (char)(uVar2 >> 0x30);
  auVar32._13_2_ = auVar16._13_2_;
  auVar48._8_4_ = 0;
  auVar48._0_8_ = uVar2;
  auVar48._12_3_ = auVar32._12_3_;
  auVar64._8_2_ = 0;
  auVar64._0_8_ = uVar2;
  auVar64[10] = (char)(uVar2 >> 0x28);
  auVar64._11_4_ = auVar48._11_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar2;
  auVar80._10_5_ = auVar64._10_5_;
  auVar96[8] = (char)(uVar2 >> 0x20);
  auVar96._0_8_ = uVar2;
  auVar96._9_6_ = auVar80._9_6_;
  auVar135._7_8_ = 0;
  auVar135._0_7_ = auVar96._8_7_;
  Var127 = CONCAT81(SUB158(auVar135 << 0x40,7),(char)(uVar2 >> 0x18));
  auVar167._9_6_ = 0;
  auVar167._0_9_ = Var127;
  auVar136._1_10_ = SUB1510(auVar167 << 0x30,5);
  auVar136[0] = (char)(uVar2 >> 0x10);
  auVar168._11_4_ = 0;
  auVar168._0_11_ = auVar136;
  auVar112[2] = (char)(uVar2 >> 8);
  auVar112._0_2_ = (ushort)uVar2;
  auVar112._3_12_ = SUB1512(auVar168 << 0x20,3);
  sVar191 = ((ushort)uVar1 & 0xff) - ((ushort)uVar2 & 0xff);
  sVar192 = auVar111._2_2_ - auVar112._2_2_;
  sVar193 = auVar134._0_2_ - auVar136._0_2_;
  sVar194 = (short)Var124 - (short)Var127;
  sVar195 = auVar95._8_2_ - auVar96._8_2_;
  sVar196 = auVar63._10_2_ - auVar64._10_2_;
  sVar197 = auVar31._12_2_ - auVar32._12_2_;
  sVar198 = (auVar15._13_2_ >> 8) - (auVar16._13_2_ >> 8);
  sVar3 = -sVar191;
  sVar4 = -sVar192;
  sVar5 = -sVar193;
  sVar6 = -sVar194;
  sVar7 = -sVar195;
  sVar8 = -sVar196;
  sVar9 = -sVar197;
  sVar10 = -sVar198;
  uVar215 = (ushort)(sVar3 < sVar191) * sVar191 | (ushort)(sVar3 >= sVar191) * sVar3;
  uVar217 = (ushort)(sVar4 < sVar192) * sVar192 | (ushort)(sVar4 >= sVar192) * sVar4;
  uVar219 = (ushort)(sVar5 < sVar193) * sVar193 | (ushort)(sVar5 >= sVar193) * sVar5;
  uVar221 = (ushort)(sVar6 < sVar194) * sVar194 | (ushort)(sVar6 >= sVar194) * sVar6;
  uVar223 = (ushort)(sVar7 < sVar195) * sVar195 | (ushort)(sVar7 >= sVar195) * sVar7;
  uVar225 = (ushort)(sVar8 < sVar196) * sVar196 | (ushort)(sVar8 >= sVar196) * sVar8;
  uVar227 = (ushort)(sVar9 < sVar197) * sVar197 | (ushort)(sVar9 >= sVar197) * sVar9;
  uVar229 = (ushort)(sVar10 < sVar198) * sVar198 | (ushort)(sVar10 >= sVar198) * sVar10;
  uVar207 = ((short)uVar199 < (short)uVar215) * uVar215 |
            ((short)uVar199 >= (short)uVar215) * uVar199;
  uVar208 = ((short)uVar200 < (short)uVar217) * uVar217 |
            ((short)uVar200 >= (short)uVar217) * uVar200;
  uVar209 = ((short)uVar201 < (short)uVar219) * uVar219 |
            ((short)uVar201 >= (short)uVar219) * uVar201;
  uVar210 = ((short)uVar202 < (short)uVar221) * uVar221 |
            ((short)uVar202 >= (short)uVar221) * uVar202;
  uVar211 = ((short)uVar203 < (short)uVar223) * uVar223 |
            ((short)uVar203 >= (short)uVar223) * uVar203;
  uVar212 = ((short)uVar204 < (short)uVar225) * uVar225 |
            ((short)uVar204 >= (short)uVar225) * uVar204;
  uVar213 = ((short)uVar205 < (short)uVar227) * uVar227 |
            ((short)uVar205 >= (short)uVar227) * uVar205;
  uVar214 = ((short)uVar206 < (short)uVar229) * uVar229 |
            ((short)uVar206 >= (short)uVar229) * uVar206;
  uVar215 = ((short)uVar216 < (short)uVar215) * uVar216 |
            ((short)uVar216 >= (short)uVar215) * uVar215;
  uVar217 = ((short)uVar218 < (short)uVar217) * uVar218 |
            ((short)uVar218 >= (short)uVar217) * uVar217;
  uVar219 = ((short)uVar220 < (short)uVar219) * uVar220 |
            ((short)uVar220 >= (short)uVar219) * uVar219;
  uVar221 = ((short)uVar222 < (short)uVar221) * uVar222 |
            ((short)uVar222 >= (short)uVar221) * uVar221;
  uVar223 = ((short)uVar224 < (short)uVar223) * uVar224 |
            ((short)uVar224 >= (short)uVar223) * uVar223;
  uVar225 = ((short)uVar226 < (short)uVar225) * uVar226 |
            ((short)uVar226 >= (short)uVar225) * uVar225;
  uVar227 = ((short)uVar228 < (short)uVar227) * uVar228 |
            ((short)uVar228 >= (short)uVar227) * uVar227;
  uVar229 = ((short)uVar230 < (short)uVar229) * uVar230 |
            ((short)uVar230 >= (short)uVar229) * uVar229;
  uVar1 = *(ulong *)(s + lVar189 * 3);
  auVar17._8_6_ = 0;
  auVar17._0_8_ = uVar1;
  auVar17[0xe] = (char)(uVar1 >> 0x38);
  auVar33._8_4_ = 0;
  auVar33._0_8_ = uVar1;
  auVar33[0xc] = (char)(uVar1 >> 0x30);
  auVar33._13_2_ = auVar17._13_2_;
  auVar49._8_4_ = 0;
  auVar49._0_8_ = uVar1;
  auVar49._12_3_ = auVar33._12_3_;
  auVar65._8_2_ = 0;
  auVar65._0_8_ = uVar1;
  auVar65[10] = (char)(uVar1 >> 0x28);
  auVar65._11_4_ = auVar49._11_4_;
  auVar81._8_2_ = 0;
  auVar81._0_8_ = uVar1;
  auVar81._10_5_ = auVar65._10_5_;
  auVar97[8] = (char)(uVar1 >> 0x20);
  auVar97._0_8_ = uVar1;
  auVar97._9_6_ = auVar81._9_6_;
  auVar137._7_8_ = 0;
  auVar137._0_7_ = auVar97._8_7_;
  Var124 = CONCAT81(SUB158(auVar137 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar169._9_6_ = 0;
  auVar169._0_9_ = Var124;
  auVar138._1_10_ = SUB1510(auVar169 << 0x30,5);
  auVar138[0] = (char)(uVar1 >> 0x10);
  auVar170._11_4_ = 0;
  auVar170._0_11_ = auVar138;
  auVar113[2] = (char)(uVar1 >> 8);
  auVar113._0_2_ = (ushort)uVar1;
  auVar113._3_12_ = SUB1512(auVar170 << 0x20,3);
  uVar2 = *(ulong *)(d + lVar190 * 3);
  auVar18._8_6_ = 0;
  auVar18._0_8_ = uVar2;
  auVar18[0xe] = (char)(uVar2 >> 0x38);
  auVar34._8_4_ = 0;
  auVar34._0_8_ = uVar2;
  auVar34[0xc] = (char)(uVar2 >> 0x30);
  auVar34._13_2_ = auVar18._13_2_;
  auVar50._8_4_ = 0;
  auVar50._0_8_ = uVar2;
  auVar50._12_3_ = auVar34._12_3_;
  auVar66._8_2_ = 0;
  auVar66._0_8_ = uVar2;
  auVar66[10] = (char)(uVar2 >> 0x28);
  auVar66._11_4_ = auVar50._11_4_;
  auVar82._8_2_ = 0;
  auVar82._0_8_ = uVar2;
  auVar82._10_5_ = auVar66._10_5_;
  auVar98[8] = (char)(uVar2 >> 0x20);
  auVar98._0_8_ = uVar2;
  auVar98._9_6_ = auVar82._9_6_;
  auVar139._7_8_ = 0;
  auVar139._0_7_ = auVar98._8_7_;
  Var127 = CONCAT81(SUB158(auVar139 << 0x40,7),(char)(uVar2 >> 0x18));
  auVar171._9_6_ = 0;
  auVar171._0_9_ = Var127;
  auVar140._1_10_ = SUB1510(auVar171 << 0x30,5);
  auVar140[0] = (char)(uVar2 >> 0x10);
  auVar172._11_4_ = 0;
  auVar172._0_11_ = auVar140;
  auVar114[2] = (char)(uVar2 >> 8);
  auVar114._0_2_ = (ushort)uVar2;
  auVar114._3_12_ = SUB1512(auVar172 << 0x20,3);
  sVar191 = ((ushort)uVar1 & 0xff) - ((ushort)uVar2 & 0xff);
  sVar192 = auVar113._2_2_ - auVar114._2_2_;
  sVar193 = auVar138._0_2_ - auVar140._0_2_;
  sVar194 = (short)Var124 - (short)Var127;
  sVar195 = auVar97._8_2_ - auVar98._8_2_;
  sVar196 = auVar65._10_2_ - auVar66._10_2_;
  sVar197 = auVar33._12_2_ - auVar34._12_2_;
  sVar198 = (auVar17._13_2_ >> 8) - (auVar18._13_2_ >> 8);
  sVar3 = -sVar191;
  sVar4 = -sVar192;
  sVar5 = -sVar193;
  sVar6 = -sVar194;
  sVar7 = -sVar195;
  sVar8 = -sVar196;
  sVar9 = -sVar197;
  sVar10 = -sVar198;
  uVar216 = (ushort)(sVar3 < sVar191) * sVar191 | (ushort)(sVar3 >= sVar191) * sVar3;
  uVar218 = (ushort)(sVar4 < sVar192) * sVar192 | (ushort)(sVar4 >= sVar192) * sVar4;
  uVar220 = (ushort)(sVar5 < sVar193) * sVar193 | (ushort)(sVar5 >= sVar193) * sVar5;
  uVar222 = (ushort)(sVar6 < sVar194) * sVar194 | (ushort)(sVar6 >= sVar194) * sVar6;
  uVar224 = (ushort)(sVar7 < sVar195) * sVar195 | (ushort)(sVar7 >= sVar195) * sVar7;
  uVar226 = (ushort)(sVar8 < sVar196) * sVar196 | (ushort)(sVar8 >= sVar196) * sVar8;
  uVar228 = (ushort)(sVar9 < sVar197) * sVar197 | (ushort)(sVar9 >= sVar197) * sVar9;
  uVar230 = (ushort)(sVar10 < sVar198) * sVar198 | (ushort)(sVar10 >= sVar198) * sVar10;
  uVar1 = *(ulong *)(s + lVar189 * 4);
  auVar19._8_6_ = 0;
  auVar19._0_8_ = uVar1;
  auVar19[0xe] = (char)(uVar1 >> 0x38);
  auVar35._8_4_ = 0;
  auVar35._0_8_ = uVar1;
  auVar35[0xc] = (char)(uVar1 >> 0x30);
  auVar35._13_2_ = auVar19._13_2_;
  auVar51._8_4_ = 0;
  auVar51._0_8_ = uVar1;
  auVar51._12_3_ = auVar35._12_3_;
  auVar67._8_2_ = 0;
  auVar67._0_8_ = uVar1;
  auVar67[10] = (char)(uVar1 >> 0x28);
  auVar67._11_4_ = auVar51._11_4_;
  auVar83._8_2_ = 0;
  auVar83._0_8_ = uVar1;
  auVar83._10_5_ = auVar67._10_5_;
  auVar99[8] = (char)(uVar1 >> 0x20);
  auVar99._0_8_ = uVar1;
  auVar99._9_6_ = auVar83._9_6_;
  auVar141._7_8_ = 0;
  auVar141._0_7_ = auVar99._8_7_;
  Var124 = CONCAT81(SUB158(auVar141 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar173._9_6_ = 0;
  auVar173._0_9_ = Var124;
  auVar142._1_10_ = SUB1510(auVar173 << 0x30,5);
  auVar142[0] = (char)(uVar1 >> 0x10);
  auVar174._11_4_ = 0;
  auVar174._0_11_ = auVar142;
  auVar115[2] = (char)(uVar1 >> 8);
  auVar115._0_2_ = (ushort)uVar1;
  auVar115._3_12_ = SUB1512(auVar174 << 0x20,3);
  uVar2 = *(ulong *)(d + lVar190 * 4);
  auVar20._8_6_ = 0;
  auVar20._0_8_ = uVar2;
  auVar20[0xe] = (char)(uVar2 >> 0x38);
  auVar36._8_4_ = 0;
  auVar36._0_8_ = uVar2;
  auVar36[0xc] = (char)(uVar2 >> 0x30);
  auVar36._13_2_ = auVar20._13_2_;
  auVar52._8_4_ = 0;
  auVar52._0_8_ = uVar2;
  auVar52._12_3_ = auVar36._12_3_;
  auVar68._8_2_ = 0;
  auVar68._0_8_ = uVar2;
  auVar68[10] = (char)(uVar2 >> 0x28);
  auVar68._11_4_ = auVar52._11_4_;
  auVar84._8_2_ = 0;
  auVar84._0_8_ = uVar2;
  auVar84._10_5_ = auVar68._10_5_;
  auVar100[8] = (char)(uVar2 >> 0x20);
  auVar100._0_8_ = uVar2;
  auVar100._9_6_ = auVar84._9_6_;
  auVar143._7_8_ = 0;
  auVar143._0_7_ = auVar100._8_7_;
  Var127 = CONCAT81(SUB158(auVar143 << 0x40,7),(char)(uVar2 >> 0x18));
  auVar175._9_6_ = 0;
  auVar175._0_9_ = Var127;
  auVar144._1_10_ = SUB1510(auVar175 << 0x30,5);
  auVar144[0] = (char)(uVar2 >> 0x10);
  auVar176._11_4_ = 0;
  auVar176._0_11_ = auVar144;
  auVar116[2] = (char)(uVar2 >> 8);
  auVar116._0_2_ = (ushort)uVar2;
  auVar116._3_12_ = SUB1512(auVar176 << 0x20,3);
  sVar191 = ((ushort)uVar1 & 0xff) - ((ushort)uVar2 & 0xff);
  sVar192 = auVar115._2_2_ - auVar116._2_2_;
  sVar193 = auVar142._0_2_ - auVar144._0_2_;
  sVar194 = (short)Var124 - (short)Var127;
  sVar195 = auVar99._8_2_ - auVar100._8_2_;
  sVar196 = auVar67._10_2_ - auVar68._10_2_;
  sVar197 = auVar35._12_2_ - auVar36._12_2_;
  sVar198 = (auVar19._13_2_ >> 8) - (auVar20._13_2_ >> 8);
  sVar3 = -sVar191;
  sVar4 = -sVar192;
  sVar5 = -sVar193;
  sVar6 = -sVar194;
  sVar7 = -sVar195;
  sVar8 = -sVar196;
  sVar9 = -sVar197;
  sVar10 = -sVar198;
  uVar231 = (ushort)(sVar3 < sVar191) * sVar191 | (ushort)(sVar3 >= sVar191) * sVar3;
  uVar232 = (ushort)(sVar4 < sVar192) * sVar192 | (ushort)(sVar4 >= sVar192) * sVar4;
  uVar233 = (ushort)(sVar5 < sVar193) * sVar193 | (ushort)(sVar5 >= sVar193) * sVar5;
  uVar234 = (ushort)(sVar6 < sVar194) * sVar194 | (ushort)(sVar6 >= sVar194) * sVar6;
  uVar235 = (ushort)(sVar7 < sVar195) * sVar195 | (ushort)(sVar7 >= sVar195) * sVar7;
  uVar236 = (ushort)(sVar8 < sVar196) * sVar196 | (ushort)(sVar8 >= sVar196) * sVar8;
  uVar237 = (ushort)(sVar9 < sVar197) * sVar197 | (ushort)(sVar9 >= sVar197) * sVar9;
  uVar238 = (ushort)(sVar10 < sVar198) * sVar198 | (ushort)(sVar10 >= sVar198) * sVar10;
  uVar199 = ((short)uVar216 < (short)uVar231) * uVar231 |
            ((short)uVar216 >= (short)uVar231) * uVar216;
  uVar200 = ((short)uVar218 < (short)uVar232) * uVar232 |
            ((short)uVar218 >= (short)uVar232) * uVar218;
  uVar201 = ((short)uVar220 < (short)uVar233) * uVar233 |
            ((short)uVar220 >= (short)uVar233) * uVar220;
  uVar202 = ((short)uVar222 < (short)uVar234) * uVar234 |
            ((short)uVar222 >= (short)uVar234) * uVar222;
  uVar203 = ((short)uVar224 < (short)uVar235) * uVar235 |
            ((short)uVar224 >= (short)uVar235) * uVar224;
  uVar204 = ((short)uVar226 < (short)uVar236) * uVar236 |
            ((short)uVar226 >= (short)uVar236) * uVar226;
  uVar205 = ((short)uVar228 < (short)uVar237) * uVar237 |
            ((short)uVar228 >= (short)uVar237) * uVar228;
  uVar206 = ((short)uVar230 < (short)uVar238) * uVar238 |
            ((short)uVar230 >= (short)uVar238) * uVar230;
  uVar199 = ((short)uVar199 < (short)uVar207) * uVar207 |
            ((short)uVar199 >= (short)uVar207) * uVar199;
  uVar200 = ((short)uVar200 < (short)uVar208) * uVar208 |
            ((short)uVar200 >= (short)uVar208) * uVar200;
  uVar201 = ((short)uVar201 < (short)uVar209) * uVar209 |
            ((short)uVar201 >= (short)uVar209) * uVar201;
  uVar202 = ((short)uVar202 < (short)uVar210) * uVar210 |
            ((short)uVar202 >= (short)uVar210) * uVar202;
  uVar203 = ((short)uVar203 < (short)uVar211) * uVar211 |
            ((short)uVar203 >= (short)uVar211) * uVar203;
  uVar204 = ((short)uVar204 < (short)uVar212) * uVar212 |
            ((short)uVar204 >= (short)uVar212) * uVar204;
  uVar205 = ((short)uVar205 < (short)uVar213) * uVar213 |
            ((short)uVar205 >= (short)uVar213) * uVar205;
  uVar206 = ((short)uVar206 < (short)uVar214) * uVar214 |
            ((short)uVar206 >= (short)uVar214) * uVar206;
  uVar207 = ((short)uVar216 < (short)uVar231) * uVar216 |
            ((short)uVar216 >= (short)uVar231) * uVar231;
  uVar208 = ((short)uVar218 < (short)uVar232) * uVar218 |
            ((short)uVar218 >= (short)uVar232) * uVar232;
  uVar209 = ((short)uVar220 < (short)uVar233) * uVar220 |
            ((short)uVar220 >= (short)uVar233) * uVar233;
  uVar210 = ((short)uVar222 < (short)uVar234) * uVar222 |
            ((short)uVar222 >= (short)uVar234) * uVar234;
  uVar211 = ((short)uVar224 < (short)uVar235) * uVar224 |
            ((short)uVar224 >= (short)uVar235) * uVar235;
  uVar212 = ((short)uVar226 < (short)uVar236) * uVar226 |
            ((short)uVar226 >= (short)uVar236) * uVar236;
  uVar213 = ((short)uVar228 < (short)uVar237) * uVar228 |
            ((short)uVar228 >= (short)uVar237) * uVar237;
  uVar214 = ((short)uVar230 < (short)uVar238) * uVar230 |
            ((short)uVar230 >= (short)uVar238) * uVar238;
  uVar216 = ((short)uVar215 < (short)uVar207) * uVar215 |
            ((short)uVar215 >= (short)uVar207) * uVar207;
  uVar218 = ((short)uVar217 < (short)uVar208) * uVar217 |
            ((short)uVar217 >= (short)uVar208) * uVar208;
  uVar220 = ((short)uVar219 < (short)uVar209) * uVar219 |
            ((short)uVar219 >= (short)uVar209) * uVar209;
  uVar222 = ((short)uVar221 < (short)uVar210) * uVar221 |
            ((short)uVar221 >= (short)uVar210) * uVar210;
  uVar224 = ((short)uVar223 < (short)uVar211) * uVar223 |
            ((short)uVar223 >= (short)uVar211) * uVar211;
  uVar226 = ((short)uVar225 < (short)uVar212) * uVar225 |
            ((short)uVar225 >= (short)uVar212) * uVar212;
  uVar228 = ((short)uVar227 < (short)uVar213) * uVar227 |
            ((short)uVar227 >= (short)uVar213) * uVar213;
  uVar230 = ((short)uVar229 < (short)uVar214) * uVar229 |
            ((short)uVar229 >= (short)uVar214) * uVar214;
  uVar1 = *(ulong *)(s + lVar189 * 5);
  auVar21._8_6_ = 0;
  auVar21._0_8_ = uVar1;
  auVar21[0xe] = (char)(uVar1 >> 0x38);
  auVar37._8_4_ = 0;
  auVar37._0_8_ = uVar1;
  auVar37[0xc] = (char)(uVar1 >> 0x30);
  auVar37._13_2_ = auVar21._13_2_;
  auVar53._8_4_ = 0;
  auVar53._0_8_ = uVar1;
  auVar53._12_3_ = auVar37._12_3_;
  auVar69._8_2_ = 0;
  auVar69._0_8_ = uVar1;
  auVar69[10] = (char)(uVar1 >> 0x28);
  auVar69._11_4_ = auVar53._11_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar1;
  auVar85._10_5_ = auVar69._10_5_;
  auVar101[8] = (char)(uVar1 >> 0x20);
  auVar101._0_8_ = uVar1;
  auVar101._9_6_ = auVar85._9_6_;
  auVar145._7_8_ = 0;
  auVar145._0_7_ = auVar101._8_7_;
  Var124 = CONCAT81(SUB158(auVar145 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar177._9_6_ = 0;
  auVar177._0_9_ = Var124;
  auVar146._1_10_ = SUB1510(auVar177 << 0x30,5);
  auVar146[0] = (char)(uVar1 >> 0x10);
  auVar178._11_4_ = 0;
  auVar178._0_11_ = auVar146;
  auVar117[2] = (char)(uVar1 >> 8);
  auVar117._0_2_ = (ushort)uVar1;
  auVar117._3_12_ = SUB1512(auVar178 << 0x20,3);
  uVar2 = *(ulong *)(d + lVar190 * 5);
  auVar22._8_6_ = 0;
  auVar22._0_8_ = uVar2;
  auVar22[0xe] = (char)(uVar2 >> 0x38);
  auVar38._8_4_ = 0;
  auVar38._0_8_ = uVar2;
  auVar38[0xc] = (char)(uVar2 >> 0x30);
  auVar38._13_2_ = auVar22._13_2_;
  auVar54._8_4_ = 0;
  auVar54._0_8_ = uVar2;
  auVar54._12_3_ = auVar38._12_3_;
  auVar70._8_2_ = 0;
  auVar70._0_8_ = uVar2;
  auVar70[10] = (char)(uVar2 >> 0x28);
  auVar70._11_4_ = auVar54._11_4_;
  auVar86._8_2_ = 0;
  auVar86._0_8_ = uVar2;
  auVar86._10_5_ = auVar70._10_5_;
  auVar102[8] = (char)(uVar2 >> 0x20);
  auVar102._0_8_ = uVar2;
  auVar102._9_6_ = auVar86._9_6_;
  auVar147._7_8_ = 0;
  auVar147._0_7_ = auVar102._8_7_;
  Var127 = CONCAT81(SUB158(auVar147 << 0x40,7),(char)(uVar2 >> 0x18));
  auVar179._9_6_ = 0;
  auVar179._0_9_ = Var127;
  auVar148._1_10_ = SUB1510(auVar179 << 0x30,5);
  auVar148[0] = (char)(uVar2 >> 0x10);
  auVar180._11_4_ = 0;
  auVar180._0_11_ = auVar148;
  auVar118[2] = (char)(uVar2 >> 8);
  auVar118._0_2_ = (ushort)uVar2;
  auVar118._3_12_ = SUB1512(auVar180 << 0x20,3);
  sVar191 = ((ushort)uVar1 & 0xff) - ((ushort)uVar2 & 0xff);
  sVar192 = auVar117._2_2_ - auVar118._2_2_;
  sVar193 = auVar146._0_2_ - auVar148._0_2_;
  sVar194 = (short)Var124 - (short)Var127;
  sVar195 = auVar101._8_2_ - auVar102._8_2_;
  sVar196 = auVar69._10_2_ - auVar70._10_2_;
  sVar197 = auVar37._12_2_ - auVar38._12_2_;
  sVar198 = (auVar21._13_2_ >> 8) - (auVar22._13_2_ >> 8);
  sVar3 = -sVar191;
  sVar4 = -sVar192;
  sVar5 = -sVar193;
  sVar6 = -sVar194;
  sVar7 = -sVar195;
  sVar8 = -sVar196;
  sVar9 = -sVar197;
  sVar10 = -sVar198;
  uVar215 = (ushort)(sVar3 < sVar191) * sVar191 | (ushort)(sVar3 >= sVar191) * sVar3;
  uVar217 = (ushort)(sVar4 < sVar192) * sVar192 | (ushort)(sVar4 >= sVar192) * sVar4;
  uVar219 = (ushort)(sVar5 < sVar193) * sVar193 | (ushort)(sVar5 >= sVar193) * sVar5;
  uVar221 = (ushort)(sVar6 < sVar194) * sVar194 | (ushort)(sVar6 >= sVar194) * sVar6;
  uVar223 = (ushort)(sVar7 < sVar195) * sVar195 | (ushort)(sVar7 >= sVar195) * sVar7;
  uVar225 = (ushort)(sVar8 < sVar196) * sVar196 | (ushort)(sVar8 >= sVar196) * sVar8;
  uVar227 = (ushort)(sVar9 < sVar197) * sVar197 | (ushort)(sVar9 >= sVar197) * sVar9;
  uVar229 = (ushort)(sVar10 < sVar198) * sVar198 | (ushort)(sVar10 >= sVar198) * sVar10;
  uVar207 = ((short)uVar199 < (short)uVar215) * uVar215 |
            ((short)uVar199 >= (short)uVar215) * uVar199;
  uVar208 = ((short)uVar200 < (short)uVar217) * uVar217 |
            ((short)uVar200 >= (short)uVar217) * uVar200;
  uVar209 = ((short)uVar201 < (short)uVar219) * uVar219 |
            ((short)uVar201 >= (short)uVar219) * uVar201;
  uVar210 = ((short)uVar202 < (short)uVar221) * uVar221 |
            ((short)uVar202 >= (short)uVar221) * uVar202;
  uVar211 = ((short)uVar203 < (short)uVar223) * uVar223 |
            ((short)uVar203 >= (short)uVar223) * uVar203;
  uVar212 = ((short)uVar204 < (short)uVar225) * uVar225 |
            ((short)uVar204 >= (short)uVar225) * uVar204;
  uVar213 = ((short)uVar205 < (short)uVar227) * uVar227 |
            ((short)uVar205 >= (short)uVar227) * uVar205;
  uVar214 = ((short)uVar206 < (short)uVar229) * uVar229 |
            ((short)uVar206 >= (short)uVar229) * uVar206;
  uVar215 = ((short)uVar216 < (short)uVar215) * uVar216 |
            ((short)uVar216 >= (short)uVar215) * uVar215;
  uVar217 = ((short)uVar218 < (short)uVar217) * uVar218 |
            ((short)uVar218 >= (short)uVar217) * uVar217;
  uVar219 = ((short)uVar220 < (short)uVar219) * uVar220 |
            ((short)uVar220 >= (short)uVar219) * uVar219;
  uVar221 = ((short)uVar222 < (short)uVar221) * uVar222 |
            ((short)uVar222 >= (short)uVar221) * uVar221;
  uVar223 = ((short)uVar224 < (short)uVar223) * uVar224 |
            ((short)uVar224 >= (short)uVar223) * uVar223;
  uVar225 = ((short)uVar226 < (short)uVar225) * uVar226 |
            ((short)uVar226 >= (short)uVar225) * uVar225;
  uVar227 = ((short)uVar228 < (short)uVar227) * uVar228 |
            ((short)uVar228 >= (short)uVar227) * uVar227;
  uVar229 = ((short)uVar230 < (short)uVar229) * uVar230 |
            ((short)uVar230 >= (short)uVar229) * uVar229;
  uVar1 = *(ulong *)(s + lVar189 * 6);
  auVar23._8_6_ = 0;
  auVar23._0_8_ = uVar1;
  auVar23[0xe] = (char)(uVar1 >> 0x38);
  auVar39._8_4_ = 0;
  auVar39._0_8_ = uVar1;
  auVar39[0xc] = (char)(uVar1 >> 0x30);
  auVar39._13_2_ = auVar23._13_2_;
  auVar55._8_4_ = 0;
  auVar55._0_8_ = uVar1;
  auVar55._12_3_ = auVar39._12_3_;
  auVar71._8_2_ = 0;
  auVar71._0_8_ = uVar1;
  auVar71[10] = (char)(uVar1 >> 0x28);
  auVar71._11_4_ = auVar55._11_4_;
  auVar87._8_2_ = 0;
  auVar87._0_8_ = uVar1;
  auVar87._10_5_ = auVar71._10_5_;
  auVar103[8] = (char)(uVar1 >> 0x20);
  auVar103._0_8_ = uVar1;
  auVar103._9_6_ = auVar87._9_6_;
  auVar149._7_8_ = 0;
  auVar149._0_7_ = auVar103._8_7_;
  Var124 = CONCAT81(SUB158(auVar149 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar181._9_6_ = 0;
  auVar181._0_9_ = Var124;
  auVar150._1_10_ = SUB1510(auVar181 << 0x30,5);
  auVar150[0] = (char)(uVar1 >> 0x10);
  auVar182._11_4_ = 0;
  auVar182._0_11_ = auVar150;
  auVar119[2] = (char)(uVar1 >> 8);
  auVar119._0_2_ = (ushort)uVar1;
  auVar119._3_12_ = SUB1512(auVar182 << 0x20,3);
  uVar2 = *(ulong *)(d + lVar190 * 6);
  auVar24._8_6_ = 0;
  auVar24._0_8_ = uVar2;
  auVar24[0xe] = (char)(uVar2 >> 0x38);
  auVar40._8_4_ = 0;
  auVar40._0_8_ = uVar2;
  auVar40[0xc] = (char)(uVar2 >> 0x30);
  auVar40._13_2_ = auVar24._13_2_;
  auVar56._8_4_ = 0;
  auVar56._0_8_ = uVar2;
  auVar56._12_3_ = auVar40._12_3_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar2;
  auVar72[10] = (char)(uVar2 >> 0x28);
  auVar72._11_4_ = auVar56._11_4_;
  auVar88._8_2_ = 0;
  auVar88._0_8_ = uVar2;
  auVar88._10_5_ = auVar72._10_5_;
  auVar104[8] = (char)(uVar2 >> 0x20);
  auVar104._0_8_ = uVar2;
  auVar104._9_6_ = auVar88._9_6_;
  auVar151._7_8_ = 0;
  auVar151._0_7_ = auVar104._8_7_;
  Var127 = CONCAT81(SUB158(auVar151 << 0x40,7),(char)(uVar2 >> 0x18));
  auVar183._9_6_ = 0;
  auVar183._0_9_ = Var127;
  auVar152._1_10_ = SUB1510(auVar183 << 0x30,5);
  auVar152[0] = (char)(uVar2 >> 0x10);
  auVar184._11_4_ = 0;
  auVar184._0_11_ = auVar152;
  auVar120[2] = (char)(uVar2 >> 8);
  auVar120._0_2_ = (ushort)uVar2;
  auVar120._3_12_ = SUB1512(auVar184 << 0x20,3);
  sVar191 = ((ushort)uVar1 & 0xff) - ((ushort)uVar2 & 0xff);
  sVar192 = auVar119._2_2_ - auVar120._2_2_;
  sVar193 = auVar150._0_2_ - auVar152._0_2_;
  sVar194 = (short)Var124 - (short)Var127;
  sVar195 = auVar103._8_2_ - auVar104._8_2_;
  sVar196 = auVar71._10_2_ - auVar72._10_2_;
  sVar197 = auVar39._12_2_ - auVar40._12_2_;
  sVar198 = (auVar23._13_2_ >> 8) - (auVar24._13_2_ >> 8);
  sVar3 = -sVar191;
  sVar4 = -sVar192;
  sVar5 = -sVar193;
  sVar6 = -sVar194;
  sVar7 = -sVar195;
  sVar8 = -sVar196;
  sVar9 = -sVar197;
  sVar10 = -sVar198;
  uVar231 = (ushort)(sVar3 < sVar191) * sVar191 | (ushort)(sVar3 >= sVar191) * sVar3;
  uVar232 = (ushort)(sVar4 < sVar192) * sVar192 | (ushort)(sVar4 >= sVar192) * sVar4;
  uVar233 = (ushort)(sVar5 < sVar193) * sVar193 | (ushort)(sVar5 >= sVar193) * sVar5;
  uVar234 = (ushort)(sVar6 < sVar194) * sVar194 | (ushort)(sVar6 >= sVar194) * sVar6;
  uVar235 = (ushort)(sVar7 < sVar195) * sVar195 | (ushort)(sVar7 >= sVar195) * sVar7;
  uVar236 = (ushort)(sVar8 < sVar196) * sVar196 | (ushort)(sVar8 >= sVar196) * sVar8;
  uVar237 = (ushort)(sVar9 < sVar197) * sVar197 | (ushort)(sVar9 >= sVar197) * sVar9;
  uVar238 = (ushort)(sVar10 < sVar198) * sVar198 | (ushort)(sVar10 >= sVar198) * sVar10;
  uVar1 = *(ulong *)(s + lVar189 * 7);
  auVar25._8_6_ = 0;
  auVar25._0_8_ = uVar1;
  auVar25[0xe] = (char)(uVar1 >> 0x38);
  auVar41._8_4_ = 0;
  auVar41._0_8_ = uVar1;
  auVar41[0xc] = (char)(uVar1 >> 0x30);
  auVar41._13_2_ = auVar25._13_2_;
  auVar57._8_4_ = 0;
  auVar57._0_8_ = uVar1;
  auVar57._12_3_ = auVar41._12_3_;
  auVar73._8_2_ = 0;
  auVar73._0_8_ = uVar1;
  auVar73[10] = (char)(uVar1 >> 0x28);
  auVar73._11_4_ = auVar57._11_4_;
  auVar89._8_2_ = 0;
  auVar89._0_8_ = uVar1;
  auVar89._10_5_ = auVar73._10_5_;
  auVar105[8] = (char)(uVar1 >> 0x20);
  auVar105._0_8_ = uVar1;
  auVar105._9_6_ = auVar89._9_6_;
  auVar153._7_8_ = 0;
  auVar153._0_7_ = auVar105._8_7_;
  Var124 = CONCAT81(SUB158(auVar153 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar185._9_6_ = 0;
  auVar185._0_9_ = Var124;
  auVar154._1_10_ = SUB1510(auVar185 << 0x30,5);
  auVar154[0] = (char)(uVar1 >> 0x10);
  auVar186._11_4_ = 0;
  auVar186._0_11_ = auVar154;
  auVar121[2] = (char)(uVar1 >> 8);
  auVar121._0_2_ = (ushort)uVar1;
  auVar121._3_12_ = SUB1512(auVar186 << 0x20,3);
  uVar2 = *(ulong *)(d + lVar190 * 7);
  auVar26._8_6_ = 0;
  auVar26._0_8_ = uVar2;
  auVar26[0xe] = (char)(uVar2 >> 0x38);
  auVar42._8_4_ = 0;
  auVar42._0_8_ = uVar2;
  auVar42[0xc] = (char)(uVar2 >> 0x30);
  auVar42._13_2_ = auVar26._13_2_;
  auVar58._8_4_ = 0;
  auVar58._0_8_ = uVar2;
  auVar58._12_3_ = auVar42._12_3_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar2;
  auVar74[10] = (char)(uVar2 >> 0x28);
  auVar74._11_4_ = auVar58._11_4_;
  auVar90._8_2_ = 0;
  auVar90._0_8_ = uVar2;
  auVar90._10_5_ = auVar74._10_5_;
  auVar106[8] = (char)(uVar2 >> 0x20);
  auVar106._0_8_ = uVar2;
  auVar106._9_6_ = auVar90._9_6_;
  auVar155._7_8_ = 0;
  auVar155._0_7_ = auVar106._8_7_;
  Var127 = CONCAT81(SUB158(auVar155 << 0x40,7),(char)(uVar2 >> 0x18));
  auVar187._9_6_ = 0;
  auVar187._0_9_ = Var127;
  auVar156._1_10_ = SUB1510(auVar187 << 0x30,5);
  auVar156[0] = (char)(uVar2 >> 0x10);
  auVar188._11_4_ = 0;
  auVar188._0_11_ = auVar156;
  auVar122[2] = (char)(uVar2 >> 8);
  auVar122._0_2_ = (ushort)uVar2;
  auVar122._3_12_ = SUB1512(auVar188 << 0x20,3);
  sVar191 = ((ushort)uVar1 & 0xff) - ((ushort)uVar2 & 0xff);
  sVar192 = auVar121._2_2_ - auVar122._2_2_;
  sVar193 = auVar154._0_2_ - auVar156._0_2_;
  sVar194 = (short)Var124 - (short)Var127;
  sVar195 = auVar105._8_2_ - auVar106._8_2_;
  sVar196 = auVar73._10_2_ - auVar74._10_2_;
  sVar197 = auVar41._12_2_ - auVar42._12_2_;
  sVar198 = (auVar25._13_2_ >> 8) - (auVar26._13_2_ >> 8);
  sVar3 = -sVar191;
  sVar4 = -sVar192;
  sVar5 = -sVar193;
  sVar6 = -sVar194;
  sVar7 = -sVar195;
  sVar8 = -sVar196;
  sVar9 = -sVar197;
  sVar10 = -sVar198;
  uVar199 = (ushort)(sVar3 < sVar191) * sVar191 | (ushort)(sVar3 >= sVar191) * sVar3;
  uVar200 = (ushort)(sVar4 < sVar192) * sVar192 | (ushort)(sVar4 >= sVar192) * sVar4;
  uVar201 = (ushort)(sVar5 < sVar193) * sVar193 | (ushort)(sVar5 >= sVar193) * sVar5;
  uVar202 = (ushort)(sVar6 < sVar194) * sVar194 | (ushort)(sVar6 >= sVar194) * sVar6;
  uVar203 = (ushort)(sVar7 < sVar195) * sVar195 | (ushort)(sVar7 >= sVar195) * sVar7;
  uVar204 = (ushort)(sVar8 < sVar196) * sVar196 | (ushort)(sVar8 >= sVar196) * sVar8;
  uVar205 = (ushort)(sVar9 < sVar197) * sVar197 | (ushort)(sVar9 >= sVar197) * sVar9;
  uVar206 = (ushort)(sVar10 < sVar198) * sVar198 | (ushort)(sVar10 >= sVar198) * sVar10;
  uVar216 = ((short)uVar231 < (short)uVar199) * uVar199 |
            ((short)uVar231 >= (short)uVar199) * uVar231;
  uVar218 = ((short)uVar232 < (short)uVar200) * uVar200 |
            ((short)uVar232 >= (short)uVar200) * uVar232;
  uVar220 = ((short)uVar233 < (short)uVar201) * uVar201 |
            ((short)uVar233 >= (short)uVar201) * uVar233;
  uVar222 = ((short)uVar234 < (short)uVar202) * uVar202 |
            ((short)uVar234 >= (short)uVar202) * uVar234;
  uVar224 = ((short)uVar235 < (short)uVar203) * uVar203 |
            ((short)uVar235 >= (short)uVar203) * uVar235;
  uVar226 = ((short)uVar236 < (short)uVar204) * uVar204 |
            ((short)uVar236 >= (short)uVar204) * uVar236;
  uVar228 = ((short)uVar237 < (short)uVar205) * uVar205 |
            ((short)uVar237 >= (short)uVar205) * uVar237;
  uVar230 = ((short)uVar238 < (short)uVar206) * uVar206 |
            ((short)uVar238 >= (short)uVar206) * uVar238;
  uVar207 = ((short)uVar216 < (short)uVar207) * uVar207 |
            ((short)uVar216 >= (short)uVar207) * uVar216;
  uVar208 = ((short)uVar218 < (short)uVar208) * uVar208 |
            ((short)uVar218 >= (short)uVar208) * uVar218;
  uVar209 = ((short)uVar220 < (short)uVar209) * uVar209 |
            ((short)uVar220 >= (short)uVar209) * uVar220;
  uVar210 = ((short)uVar222 < (short)uVar210) * uVar210 |
            ((short)uVar222 >= (short)uVar210) * uVar222;
  uVar211 = ((short)uVar224 < (short)uVar211) * uVar211 |
            ((short)uVar224 >= (short)uVar211) * uVar224;
  uVar212 = ((short)uVar226 < (short)uVar212) * uVar212 |
            ((short)uVar226 >= (short)uVar212) * uVar226;
  uVar213 = ((short)uVar228 < (short)uVar213) * uVar213 |
            ((short)uVar228 >= (short)uVar213) * uVar228;
  uVar214 = ((short)uVar230 < (short)uVar214) * uVar214 |
            ((short)uVar230 >= (short)uVar214) * uVar230;
  uVar199 = ((short)uVar231 < (short)uVar199) * uVar231 |
            ((short)uVar231 >= (short)uVar199) * uVar199;
  uVar200 = ((short)uVar232 < (short)uVar200) * uVar232 |
            ((short)uVar232 >= (short)uVar200) * uVar200;
  uVar201 = ((short)uVar233 < (short)uVar201) * uVar233 |
            ((short)uVar233 >= (short)uVar201) * uVar201;
  uVar202 = ((short)uVar234 < (short)uVar202) * uVar234 |
            ((short)uVar234 >= (short)uVar202) * uVar202;
  uVar203 = ((short)uVar235 < (short)uVar203) * uVar235 |
            ((short)uVar235 >= (short)uVar203) * uVar203;
  uVar204 = ((short)uVar236 < (short)uVar204) * uVar236 |
            ((short)uVar236 >= (short)uVar204) * uVar204;
  uVar205 = ((short)uVar237 < (short)uVar205) * uVar237 |
            ((short)uVar237 >= (short)uVar205) * uVar205;
  uVar206 = ((short)uVar238 < (short)uVar206) * uVar238 |
            ((short)uVar238 >= (short)uVar206) * uVar206;
  uVar199 = ((short)uVar215 < (short)uVar199) * uVar215 |
            ((short)uVar215 >= (short)uVar199) * uVar199;
  uVar200 = ((short)uVar217 < (short)uVar200) * uVar217 |
            ((short)uVar217 >= (short)uVar200) * uVar200;
  uVar201 = ((short)uVar219 < (short)uVar201) * uVar219 |
            ((short)uVar219 >= (short)uVar201) * uVar201;
  uVar202 = ((short)uVar221 < (short)uVar202) * uVar221 |
            ((short)uVar221 >= (short)uVar202) * uVar202;
  uVar203 = ((short)uVar223 < (short)uVar203) * uVar223 |
            ((short)uVar223 >= (short)uVar203) * uVar203;
  uVar204 = ((short)uVar225 < (short)uVar204) * uVar225 |
            ((short)uVar225 >= (short)uVar204) * uVar204;
  uVar205 = ((short)uVar227 < (short)uVar205) * uVar227 |
            ((short)uVar227 >= (short)uVar205) * uVar205;
  uVar206 = ((short)uVar229 < (short)uVar206) * uVar229 |
            ((short)uVar229 >= (short)uVar206) * uVar206;
  uVar207 = ((short)uVar211 < (short)uVar207) * uVar207 |
            ((short)uVar211 >= (short)uVar207) * uVar211;
  uVar208 = ((short)uVar212 < (short)uVar208) * uVar208 |
            ((short)uVar212 >= (short)uVar208) * uVar212;
  uVar209 = ((short)uVar213 < (short)uVar209) * uVar209 |
            ((short)uVar213 >= (short)uVar209) * uVar213;
  uVar210 = ((short)uVar214 < (short)uVar210) * uVar210 |
            ((short)uVar214 >= (short)uVar210) * uVar214;
  uVar207 = ((short)uVar209 < (short)uVar207) * uVar207 |
            ((short)uVar209 >= (short)uVar207) * uVar209;
  uVar208 = ((short)uVar210 < (short)uVar208) * uVar208 |
            ((short)uVar210 >= (short)uVar208) * uVar210;
  *max = (uint)(ushort)(((short)uVar208 < (short)uVar207) * uVar207 |
                       ((short)uVar208 >= (short)uVar207) * uVar208);
  uVar199 = ((short)uVar199 < (short)uVar203) * uVar199 |
            ((short)uVar199 >= (short)uVar203) * uVar203;
  uVar200 = ((short)uVar200 < (short)uVar204) * uVar200 |
            ((short)uVar200 >= (short)uVar204) * uVar204;
  uVar201 = ((short)uVar201 < (short)uVar205) * uVar201 |
            ((short)uVar201 >= (short)uVar205) * uVar205;
  uVar202 = ((short)uVar202 < (short)uVar206) * uVar202 |
            ((short)uVar202 >= (short)uVar206) * uVar206;
  uVar199 = ((short)uVar199 < (short)uVar201) * uVar199 |
            ((short)uVar199 >= (short)uVar201) * uVar201;
  uVar200 = ((short)uVar200 < (short)uVar202) * uVar200 |
            ((short)uVar200 >= (short)uVar202) * uVar202;
  *min = (uint)(ushort)(((short)uVar199 < (short)uVar200) * uVar199 |
                       ((short)uVar199 >= (short)uVar200) * uVar200);
  return;
}

Assistant:

void aom_minmax_8x8_sse2(const uint8_t *s, int p, const uint8_t *d, int dp,
                         int *min, int *max) {
  __m128i u0, s0, d0, diff, maxabsdiff, minabsdiff, negdiff, absdiff0, absdiff;
  u0 = _mm_setzero_si128();
  // Row 0
  s0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(s)), u0);
  d0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(d)), u0);
  diff = _mm_subs_epi16(s0, d0);
  negdiff = _mm_subs_epi16(u0, diff);
  absdiff0 = _mm_max_epi16(diff, negdiff);
  // Row 1
  s0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(s + p)), u0);
  d0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(d + dp)), u0);
  diff = _mm_subs_epi16(s0, d0);
  negdiff = _mm_subs_epi16(u0, diff);
  absdiff = _mm_max_epi16(diff, negdiff);
  maxabsdiff = _mm_max_epi16(absdiff0, absdiff);
  minabsdiff = _mm_min_epi16(absdiff0, absdiff);
  // Row 2
  s0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(s + 2 * p)), u0);
  d0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(d + 2 * dp)), u0);
  diff = _mm_subs_epi16(s0, d0);
  negdiff = _mm_subs_epi16(u0, diff);
  absdiff = _mm_max_epi16(diff, negdiff);
  maxabsdiff = _mm_max_epi16(maxabsdiff, absdiff);
  minabsdiff = _mm_min_epi16(minabsdiff, absdiff);
  // Row 3
  s0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(s + 3 * p)), u0);
  d0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(d + 3 * dp)), u0);
  diff = _mm_subs_epi16(s0, d0);
  negdiff = _mm_subs_epi16(u0, diff);
  absdiff = _mm_max_epi16(diff, negdiff);
  maxabsdiff = _mm_max_epi16(maxabsdiff, absdiff);
  minabsdiff = _mm_min_epi16(minabsdiff, absdiff);
  // Row 4
  s0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(s + 4 * p)), u0);
  d0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(d + 4 * dp)), u0);
  diff = _mm_subs_epi16(s0, d0);
  negdiff = _mm_subs_epi16(u0, diff);
  absdiff = _mm_max_epi16(diff, negdiff);
  maxabsdiff = _mm_max_epi16(maxabsdiff, absdiff);
  minabsdiff = _mm_min_epi16(minabsdiff, absdiff);
  // Row 5
  s0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(s + 5 * p)), u0);
  d0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(d + 5 * dp)), u0);
  diff = _mm_subs_epi16(s0, d0);
  negdiff = _mm_subs_epi16(u0, diff);
  absdiff = _mm_max_epi16(diff, negdiff);
  maxabsdiff = _mm_max_epi16(maxabsdiff, absdiff);
  minabsdiff = _mm_min_epi16(minabsdiff, absdiff);
  // Row 6
  s0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(s + 6 * p)), u0);
  d0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(d + 6 * dp)), u0);
  diff = _mm_subs_epi16(s0, d0);
  negdiff = _mm_subs_epi16(u0, diff);
  absdiff = _mm_max_epi16(diff, negdiff);
  maxabsdiff = _mm_max_epi16(maxabsdiff, absdiff);
  minabsdiff = _mm_min_epi16(minabsdiff, absdiff);
  // Row 7
  s0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(s + 7 * p)), u0);
  d0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(d + 7 * dp)), u0);
  diff = _mm_subs_epi16(s0, d0);
  negdiff = _mm_subs_epi16(u0, diff);
  absdiff = _mm_max_epi16(diff, negdiff);
  maxabsdiff = _mm_max_epi16(maxabsdiff, absdiff);
  minabsdiff = _mm_min_epi16(minabsdiff, absdiff);

  maxabsdiff = _mm_max_epi16(maxabsdiff, _mm_srli_si128(maxabsdiff, 8));
  maxabsdiff = _mm_max_epi16(maxabsdiff, _mm_srli_epi64(maxabsdiff, 32));
  maxabsdiff = _mm_max_epi16(maxabsdiff, _mm_srli_epi64(maxabsdiff, 16));
  *max = _mm_extract_epi16(maxabsdiff, 0);

  minabsdiff = _mm_min_epi16(minabsdiff, _mm_srli_si128(minabsdiff, 8));
  minabsdiff = _mm_min_epi16(minabsdiff, _mm_srli_epi64(minabsdiff, 32));
  minabsdiff = _mm_min_epi16(minabsdiff, _mm_srli_epi64(minabsdiff, 16));
  *min = _mm_extract_epi16(minabsdiff, 0);
}